

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O0

Map * add_gh_room_6(RandomizerWorld *world,MapPalette *pal)

{
  Map *pMVar1;
  Map *pMVar2;
  MapLayout *layout;
  Blockset *value;
  vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_> *this;
  Entity *pEVar3;
  Attributes local_1a0;
  undefined1 local_149;
  Attributes local_148;
  undefined1 local_f1;
  Attributes local_f0;
  undefined1 local_9d;
  Attributes local_90;
  Flag local_40;
  GlobalEntityMaskFlag local_30;
  Map *local_20;
  Map *map;
  MapPalette *pal_local;
  RandomizerWorld *world_local;
  
  map = (Map *)pal;
  pal_local = (MapPalette *)world;
  pMVar1 = World::map(&world->super_World,0x3c);
  local_20 = pMVar1;
  pMVar2 = World::map((World *)pal_local,0x162);
  layout = Map::layout(pMVar2);
  Map::layout(pMVar1,layout);
  pMVar1 = local_20;
  pMVar2 = World::map((World *)pal_local,0x162);
  value = Map::blockset(pMVar2);
  Map::blockset(pMVar1,value);
  Map::palette(local_20,(MapPalette *)map);
  Map::background_music(local_20,'\x14');
  Map::visited_flag(local_20,&FLAG_CLEARED_GH_5);
  this = Map::global_entity_mask_flags(local_20);
  Flag::Flag(&local_40,&FLAG_CLEARED_GH_6);
  GlobalEntityMaskFlag::GlobalEntityMaskFlag(&local_30,&local_40,'\0');
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>(this,&local_30);
  pMVar1 = local_20;
  pEVar3 = (Entity *)operator_new(0x58);
  local_9d = 1;
  local_90.type_id = 0xab;
  Position::Position(&local_90.position,'\x19','\x1a','\x02',false,false,false);
  local_90.orientation = '\0';
  local_90.palette = '\x01';
  local_90.speed = '\0';
  local_90.fightable = false;
  local_90.liftable = false;
  local_90.can_pass_through = false;
  local_90.appear_after_player_moved_away = false;
  local_90.gravity_immune = false;
  local_90.talkable = false;
  local_90.dialogue = '\0';
  local_90.behavior_id = 0;
  local_90.entity_to_use_tiles_from = (Entity *)0x0;
  local_90.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_90.mask_flags);
  Flag::Flag(&local_90.persistence_flag,0xff,0xff);
  local_90.flag_unknown_2_3 = false;
  local_90.flag_unknown_2_4 = false;
  local_90.flag_unknown_3_5 = false;
  Entity::Entity(pEVar3,&local_90);
  local_9d = 0;
  Map::add_entity(pMVar1,pEVar3);
  Entity::Attributes::~Attributes(&local_90);
  pMVar1 = local_20;
  pEVar3 = (Entity *)operator_new(0x58);
  local_f1 = 1;
  local_f0.type_id = 'h';
  Position::Position(&local_f0.position,'\x11','\x19','\x02',false,false,false);
  local_f0.orientation = '\x01';
  local_f0.palette = '\0';
  local_f0.speed = '\0';
  local_f0.fightable = false;
  local_f0.liftable = false;
  local_f0.can_pass_through = false;
  local_f0.appear_after_player_moved_away = false;
  local_f0.gravity_immune = false;
  local_f0.talkable = false;
  local_f0.dialogue = '\0';
  local_f0.behavior_id = 0;
  local_f0.entity_to_use_tiles_from = (Entity *)0x0;
  local_f0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_f0.mask_flags);
  Flag::Flag(&local_f0.persistence_flag,0xff,0xff);
  local_f0.flag_unknown_2_3 = false;
  local_f0.flag_unknown_2_4 = false;
  local_f0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar3,&local_f0);
  local_f1 = 0;
  Map::add_entity(pMVar1,pEVar3);
  Entity::Attributes::~Attributes(&local_f0);
  pMVar1 = local_20;
  pEVar3 = (Entity *)operator_new(0x58);
  local_149 = 1;
  local_148.type_id = 'h';
  Position::Position(&local_148.position,'\x19','\x11','\x02',false,false,false);
  local_148.orientation = '\0';
  local_148.palette = '\0';
  local_148.speed = '\0';
  local_148.fightable = false;
  local_148.liftable = false;
  local_148.can_pass_through = false;
  local_148.appear_after_player_moved_away = false;
  local_148.gravity_immune = false;
  local_148.talkable = false;
  local_148.dialogue = '\0';
  local_148.behavior_id = 0;
  local_148.entity_to_use_tiles_from = (Entity *)0x0;
  local_148.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_148.mask_flags);
  Flag::Flag(&local_148.persistence_flag,0xff,0xff);
  local_148.flag_unknown_2_3 = false;
  local_148.flag_unknown_2_4 = false;
  local_148.flag_unknown_3_5 = false;
  Entity::Entity(pEVar3,&local_148);
  local_149 = 0;
  Map::add_entity(pMVar1,pEVar3);
  Entity::Attributes::~Attributes(&local_148);
  pMVar1 = local_20;
  pEVar3 = (Entity *)operator_new(0x58);
  local_1a0.type_id = 'g';
  Position::Position(&local_1a0.position,'!','\x19','\x02',false,false,false);
  local_1a0.orientation = '\x01';
  local_1a0.palette = '\0';
  local_1a0.speed = '\0';
  local_1a0.fightable = false;
  local_1a0.liftable = false;
  local_1a0.can_pass_through = false;
  local_1a0.appear_after_player_moved_away = false;
  local_1a0.gravity_immune = false;
  local_1a0.talkable = false;
  local_1a0.dialogue = '\0';
  local_1a0.behavior_id = 0x6a;
  local_1a0.entity_to_use_tiles_from = (Entity *)0x0;
  local_1a0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_1a0.mask_flags);
  Flag::Flag(&local_1a0.persistence_flag,0xff,0xff);
  local_1a0.flag_unknown_2_3 = false;
  local_1a0.flag_unknown_2_4 = false;
  local_1a0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar3,&local_1a0);
  Map::add_entity(pMVar1,pEVar3);
  Entity::Attributes::~Attributes(&local_1a0);
  return local_20;
}

Assistant:

static Map* add_gh_room_6(RandomizerWorld& world, MapPalette* pal)
{
    Map* map = world.map(MAP_GOLAS_HEART_6);

    map->layout(world.map(MAP_LAKE_SHRINE_354)->layout());
    map->blockset(world.map(MAP_LAKE_SHRINE_354)->blockset());
    map->palette(pal);
    map->background_music(MUSIC_GOLAS_HEART);
    map->visited_flag(FLAG_CLEARED_GH_5);
    map->global_entity_mask_flags().emplace_back(GlobalEntityMaskFlag(FLAG_CLEARED_GH_6, 0));

    map->add_entity(new Entity({
        .type_id = ENEMY_QUAKE_2,
        .position = Position(0x19, 0x1A, 0x2),
        .orientation = ENTITY_ORIENTATION_NE,
        .palette = 1
    }));

    map->add_entity(new Entity({
        .type_id = ENTITY_GATE_NORTH,
        .position = Position(0x11, 0x19, 0x2),
        .orientation = ENTITY_ORIENTATION_SE,
        .palette = 0
    }));

    map->add_entity(new Entity({
        .type_id = ENTITY_GATE_NORTH,
        .position = Position(0x19, 0x11, 0x2),
        .palette = 0
    }));

    map->add_entity(new Entity({
        .type_id = ENTITY_GATE_SOUTH,
        .position = Position(0x21, 0x19, 0x2),
        .orientation = ENTITY_ORIENTATION_SE,
        .palette = 0,
        .behavior_id = 106
    }));

    return map;
}